

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_construct_local_link
              (mg_connection *conn,char *buf,size_t buflen,char *define_proto,int define_port,
              char *define_uri)

{
  char cVar1;
  sa_family_t sVar2;
  mg_domain_context *pmVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *dst;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  int truncated;
  char *local_90;
  char *local_88;
  size_t local_80;
  char portstr [16];
  char server_ip [48];
  
  if (conn == (mg_connection *)0x0) {
    return -1;
  }
  if (buf == (char *)0x0) {
    return -1;
  }
  if (buflen == 0) {
    return -1;
  }
  truncated = 0;
  local_90 = define_proto;
  if (define_proto == (char *)0x0) {
    bVar13 = (conn->request_info).is_ssl != 0;
    pcVar8 = "ws";
    if (bVar13) {
      pcVar8 = "wss";
    }
    local_90 = "https";
    if (!bVar13) {
      local_90 = "http";
    }
    if (conn->protocol_type == 1) {
      local_90 = pcVar8;
    }
  }
  pcVar8 = (conn->request_info).request_uri;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (conn->request_info).local_uri;
  }
  if (define_port < 1) {
    define_port = (conn->request_info).server_port;
  }
  if (pcVar8 == (char *)0x0) {
    return -1;
  }
  local_88 = buf;
  local_80 = buflen;
  sVar6 = strlen(pcVar8);
  sVar6 = sVar6 * 3 + 1;
  dst = (char *)malloc(sVar6);
  if (dst == (char *)0x0) {
    return -1;
  }
  mg_url_encode(pcVar8,dst,sVar6);
  uVar7 = 0;
  uVar9 = 0;
  do {
    cVar1 = dst[uVar9];
    if (cVar1 == '%') {
      if (dst[(ulong)uVar9 + 1] != '2') goto LAB_0010bafa;
      cVar10 = '/';
      iVar4 = 3;
      if (dst[(ulong)uVar9 + 2] != 'f') goto LAB_0010bafa;
    }
    else {
      if (cVar1 == '\0') {
        dst[uVar7 & 0xffffffff] = '\0';
        if (define_proto == (char *)0x0) {
          iVar4 = 0x1bb;
          if ((conn->request_info).is_ssl == 0) {
            iVar4 = 0x50;
          }
        }
        else {
          iVar4 = strcmp(define_proto,"https");
          if ((iVar4 == 0) || (iVar4 = strcmp(define_proto,"wss"), iVar4 == 0)) {
            iVar4 = 0x1bb;
          }
          else {
            iVar4 = 0x50;
          }
        }
        sVar2 = (conn->client).lsa.sa.sa_family;
        pmVar3 = conn->dom_ctx;
        pcVar8 = pmVar3->config[0x1f];
        if (pcVar8 == (char *)0x0) {
          bVar13 = false;
        }
        else {
          iVar5 = mg_strcasecmp(pcVar8,"yes");
          bVar13 = iVar5 == 0;
        }
        pcVar8 = pmVar3->config[0x1e];
        if (define_port == iVar4) {
          portstr[0] = '\0';
        }
        else {
          sprintf(portstr,":%u");
        }
        if (!(bool)(bVar13 & pcVar8 != (char *)0x0)) {
          pcVar8 = server_ip;
          sockaddr_to_string(pcVar8,0x30,&(conn->client).lsa);
        }
        bVar13 = sVar2 != 10;
        pcVar11 = "[";
        if (bVar13 || pcVar8 != server_ip) {
          pcVar11 = "";
        }
        pcVar12 = "]";
        if (bVar13 || pcVar8 != server_ip) {
          pcVar12 = "";
        }
        mg_snprintf(conn,&truncated,local_88,local_80,"%s://%s%s%s%s%s",local_90,pcVar11,pcVar8,
                    pcVar12,portstr,dst);
        free(dst);
        return -(uint)(truncated != 0);
      }
LAB_0010bafa:
      iVar4 = 1;
      cVar10 = cVar1;
    }
    uVar9 = uVar9 + iVar4;
    dst[uVar7] = cVar10;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static int
mg_construct_local_link(const struct mg_connection *conn,
                        char *buf,
                        size_t buflen,
                        const char *define_proto,
                        int define_port,
                        const char *define_uri)
{
	if ((buflen < 1) || (buf == 0) || (conn == 0)) {
		return -1;
	} else {
		int i, j;
		int truncated = 0;
		const struct mg_request_info *ri = &conn->request_info;

		const char *proto =
		    (define_proto != NULL) ? define_proto : get_proto_name(conn);
		const char *uri =
		    (define_uri != NULL)
		        ? define_uri
		        : ((ri->request_uri != NULL) ? ri->request_uri : ri->local_uri);
		int port = (define_port > 0) ? define_port : ri->server_port;
		int default_port = 80;
		char *uri_encoded;
		size_t uri_encoded_len;

		if (uri == NULL) {
			return -1;
		}

		uri_encoded_len = strlen(uri) * 3 + 1;
		uri_encoded = (char *)mg_malloc_ctx(uri_encoded_len, conn->phys_ctx);
		if (uri_encoded == NULL) {
			return -1;
		}
		mg_url_encode(uri, uri_encoded, uri_encoded_len);

		/* Directory separator should be preserved. */
		for (i = j = 0; uri_encoded[i]; j++) {
			if (!strncmp(uri_encoded + i, "%2f", 3)) {
				uri_encoded[j] = '/';
				i += 3;
			} else {
				uri_encoded[j] = uri_encoded[i++];
			}
		}
		uri_encoded[j] = '\0';

#if defined(USE_X_DOM_SOCKET)
		if (conn->client.lsa.sa.sa_family == AF_UNIX) {
			/* TODO: Define and document a link for UNIX domain sockets. */
			/* There seems to be no official standard for this.
			 * Common uses seem to be "httpunix://", "http.unix://" or
			 * "http+unix://" as a protocol definition string, followed by
			 * "localhost" or "127.0.0.1" or "/tmp/unix/path" or
			 * "%2Ftmp%2Funix%2Fpath" (url % encoded) or
			 * "localhost:%2Ftmp%2Funix%2Fpath" (domain socket path as port) or
			 * "" (completely skipping the server name part). In any case, the
			 * last part is the server local path. */
			const char *server_name = UNIX_DOMAIN_SOCKET_SERVER_NAME;
			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
			            "%s.unix://%s%s",
			            proto,
			            server_name,
			            ri->local_uri);
			default_port = 0;
			mg_free(uri_encoded);
			return 0;
		}
#endif

		if (define_proto) {
			/* If we got a protocol name, use the default port accordingly. */
			if ((0 == strcmp(define_proto, "https"))
			    || (0 == strcmp(define_proto, "wss"))) {
				default_port = 443;
			}
		} else if (ri->is_ssl) {
			/* If we did not get a protocol name, use TLS as default if it is
			 * already used. */
			default_port = 443;
		}

		{
#if defined(USE_IPV6)
			int is_ipv6 = (conn->client.lsa.sa.sa_family == AF_INET6);
#endif
			int auth_domain_check_enabled =
			    conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK]
			    && (!mg_strcasecmp(
			           conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK], "yes"));

			const char *server_domain =
			    conn->dom_ctx->config[AUTHENTICATION_DOMAIN];

			char portstr[16];
			char server_ip[48];

			if (port != default_port) {
				sprintf(portstr, ":%u", (unsigned)port);
			} else {
				portstr[0] = 0;
			}

			if (!auth_domain_check_enabled || !server_domain) {

				sockaddr_to_string(server_ip,
				                   sizeof(server_ip),
				                   &conn->client.lsa);

				server_domain = server_ip;
			}

			mg_snprintf(conn,
			            &truncated,
			            buf,
			            buflen,
#if defined(USE_IPV6)
			            "%s://%s%s%s%s%s",
			            proto,
			            (is_ipv6 && (server_domain == server_ip)) ? "[" : "",
			            server_domain,
			            (is_ipv6 && (server_domain == server_ip)) ? "]" : "",
#else
			            "%s://%s%s%s",
			            proto,
			            server_domain,
#endif
			            portstr,
			            uri_encoded);

			mg_free(uri_encoded);
			if (truncated) {
				return -1;
			}
			return 0;
		}
	}
}